

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

string * __thiscall
re2::PrefilterTree::DebugNodeString_abi_cxx11_
          (string *__return_storage_ptr__,PrefilterTree *this,Prefilter *node)

{
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *pvVar1;
  ulong uVar2;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  if (node->op_ == ATOM) {
    if ((node->atom_)._M_string_length == 0) {
      __assert_fail("!node->atom().empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                    ,0x176,"std::string re2::PrefilterTree::DebugNodeString(Prefilter *) const");
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar2 = 0; pvVar1 = Prefilter::subs(node),
        uVar2 < (ulong)((long)(pvVar1->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar1->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pvVar1 = Prefilter::subs(node);
      StringPrintf_abi_cxx11_
                (&local_50,"%d",
                 (ulong)(uint)(pvVar1->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar2]->unique_id_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pvVar1 = Prefilter::subs(node);
      DebugNodeString_abi_cxx11_
                (&local_50,this,
                 (pvVar1->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar2]);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrefilterTree::DebugNodeString(Prefilter* node) const {
  std::string node_string = "";
  if (node->op() == Prefilter::ATOM) {
    DCHECK(!node->atom().empty());
    node_string += node->atom();
  } else {
    // Adding the operation disambiguates AND and OR nodes.
    node_string +=  node->op() == Prefilter::AND ? "AND" : "OR";
    node_string += "(";
    for (size_t i = 0; i < node->subs()->size(); i++) {
      if (i > 0)
        node_string += ',';
      node_string += StringPrintf("%d", (*node->subs())[i]->unique_id());
      node_string += ":";
      node_string += DebugNodeString((*node->subs())[i]);
    }
    node_string += ")";
  }
  return node_string;
}